

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O0

int lj_ffh_bit_lshift(lua_State *L)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long in_RDI;
  lua_State *unaff_retaddr;
  int32_t sh;
  uint64_t x;
  CTypeID id2;
  CTypeID id;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  int iVar5;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  undefined8 in_stack_fffffffffffffff8;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  iVar5 = 0;
  uVar4 = 0;
  uVar2 = lj_carith_check64(unaff_retaddr,iVar1,
                            (CTypeID *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0)
                           );
  uVar3 = lj_carith_check64(unaff_retaddr,iVar1,
                            (CTypeID *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0)
                           );
  iVar1 = (int)uVar3;
  if (iVar5 == 0) {
    *(double *)(*(long *)(in_RDI + 0x10) + 8) = (double)iVar1;
    iVar1 = 0;
  }
  else {
    uVar2 = lj_carith_shift64(uVar2,iVar1,
                              *(byte *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8) + 6) - 0x43)
    ;
    iVar1 = bit_result64((lua_State *)CONCAT44(iVar5,uVar4),(CTypeID)(uVar2 >> 0x20),
                         CONCAT44(iVar1,in_stack_ffffffffffffffd0));
  }
  return iVar1;
}

Assistant:

LJLIB_ASM(bit_lshift)		LJLIB_REC(bit_shift IR_BSHL)
{
#if LJ_HASFFI
  CTypeID id = 0, id2 = 0;
  uint64_t x = lj_carith_check64(L, 1, &id);
  int32_t sh = (int32_t)lj_carith_check64(L, 2, &id2);
  if (id) {
    x = lj_carith_shift64(x, sh, curr_func(L)->c.ffid - (int)FF_bit_lshift);
    return bit_result64(L, id, x);
  }
  setintV(L->base+1, sh);
  return FFH_RETRY;
#else
  lj_lib_checknumber(L, 1);
  bit_checkbit(L, 2);
  return FFH_RETRY;
#endif
}